

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O0

const_iterator
deqp::gles2::Functional::UniformCase::BasicUniform::findWithName
          (vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
           *vec,char *name)

{
  bool bVar1;
  pointer __lhs;
  const_iterator cVar2;
  __normal_iterator<const_deqp::gles2::Functional::UniformCase::BasicUniform_*,_std::vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>_>
  local_28;
  char *local_20;
  char *name_local;
  vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  *vec_local;
  const_iterator it;
  
  local_20 = name;
  name_local = (char *)vec;
  vec_local = (vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
               *)std::
                 vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                 ::begin(vec);
  while( true ) {
    local_28._M_current =
         (BasicUniform *)
         std::
         vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
         ::end((vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                *)name_local);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_deqp::gles2::Functional::UniformCase::BasicUniform_*,_std::vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>_>
                        *)&vec_local,&local_28);
    if (!bVar1) {
      cVar2 = std::
              vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
              ::end((vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                     *)name_local);
      return (const_iterator)cVar2._M_current;
    }
    __lhs = __gnu_cxx::
            __normal_iterator<const_deqp::gles2::Functional::UniformCase::BasicUniform_*,_std::vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>_>
            ::operator->((__normal_iterator<const_deqp::gles2::Functional::UniformCase::BasicUniform_*,_std::vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>_>
                          *)&vec_local);
    bVar1 = std::operator==(&__lhs->name,local_20);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_deqp::gles2::Functional::UniformCase::BasicUniform_*,_std::vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>_>
    ::operator++((__normal_iterator<const_deqp::gles2::Functional::UniformCase::BasicUniform_*,_std::vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>_>
                  *)&vec_local,0);
  }
  return (const_iterator)(BasicUniform *)vec_local;
}

Assistant:

static vector<BasicUniform>::const_iterator findWithName (const vector<BasicUniform>& vec, const char* const name)
		{
			for (vector<BasicUniform>::const_iterator it = vec.begin(); it != vec.end(); it++)
			{
				if (it->name == name)
					return it;
			}
			return vec.end();
		}